

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall glslang::AccessChainTraverser::AccessChainTraverser(AccessChainTraverser *this)

{
  TPoolAllocator *pTVar1;
  
  (this->super_TIntermTraverser)._vptr_TIntermTraverser =
       (_func_int **)&PTR__TIntermTraverser_00923c08;
  (this->super_TIntermTraverser).preVisit = false;
  (this->super_TIntermTraverser).inVisit = false;
  (this->super_TIntermTraverser).postVisit = true;
  (this->super_TIntermTraverser).path.
  super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
  super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
  (this->super_TIntermTraverser).path.
  super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TIntermTraverser).path.
  super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TIntermTraverser).path.
  super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->super_TIntermTraverser).rightToLeft = 0;
  *(undefined1 *)((long)&(this->super_TIntermTraverser).maxDepth + 3) = 0;
  pTVar1 = GetThreadPoolAllocator();
  (this->super_TIntermTraverser).path.
  super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
  super__Tp_alloc_type.allocator = pTVar1;
  (this->super_TIntermTraverser).path.
  super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TIntermTraverser).path.
  super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TIntermTraverser).path.
  super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TIntermTraverser)._vptr_TIntermTraverser =
       (_func_int **)&PTR__AccessChainTraverser_0092b038;
  pTVar1 = GetThreadPoolAllocator();
  (this->path)._M_dataplus.super_allocator_type.allocator = pTVar1;
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&this->path,
             "");
  this->topLevelStorageQualifier = EvqLast;
  return;
}

Assistant:

AccessChainTraverser() : TIntermTraverser(false, false, true)
    {}